

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O3

void __thiscall
UnscentedKalmanFilter_computeKalmanGain_Test::TestBody
          (UnscentedKalmanFilter_computeKalmanGain_Test *this)

{
  float *s;
  UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_> *pUVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_> *pCVar5;
  CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *pCVar6;
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *pCVar7;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *this_00;
  CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *pCVar8;
  CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *pCVar9;
  long lVar10;
  char *pcVar11;
  bool bVar12;
  undefined1 local_208 [8];
  UnscentedKalmanFilter<Kalman::Vector<float,_3>_> ukf;
  Scalar local_130;
  Scalar local_12c;
  Scalar local_128;
  Scalar local_124;
  Scalar local_120;
  Scalar local_11c;
  undefined1 local_118 [8];
  Matrix<T,_3,_2> P_xy_ref;
  undefined1 local_f8 [8];
  Matrix<T,_2,_2> P_yy;
  template_SigmaPoints<decltype(mean)> sigmaPoints;
  Matrix<T,_3,_2> K_ref;
  Vector<float,_2> mean;
  Scalar local_84;
  Scalar local_80;
  Scalar local_7c;
  Scalar local_78;
  Scalar local_74;
  undefined1 local_70 [8];
  Matrix<T,_3,_2> K;
  Scalar local_50 [2];
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0x13] = 1.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0x14] = 2.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.alpha = 1.0;
  Kalman::UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>::computeWeights
            ((UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_> *)local_208);
  local_208._0_4_ = 0.0;
  local_208._4_4_ = 0.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
  super_KalmanFilterBase<Kalman::Vector<float,_3>_>.x.super_Matrix<float,_3,_1>.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma = 1.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.lambda = 0.0;
  ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 1.0;
  ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
  ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 1.0;
  P_yy.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array._8_8_ =
       (long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_m.
              super_Matrix<float,_7,_1>.super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.
              m_storage.m_data + 0x14;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[0]
       = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[1]
       = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[2]
       = 1.4013e-45;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[3]
       = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[4]
       = 1.4013e-45;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[5]
       = 0.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_m.
  super_Matrix<float,_7,_1>.super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage.
  m_data.array[5] = 3.0;
  local_70._0_4_ = 0x40a00000;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_> *)
                      (P_yy.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.
                       m_data.array + 2),(Scalar *)local_70);
  local_118._0_4_ = 5.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (pCVar5,(Scalar *)local_118);
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
  [0xd] = 5.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (pCVar5,sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>
                             .m_storage.m_data.array + 0xd);
  local_f8._0_4_ = 5.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (pCVar5,(Scalar *)local_f8);
  local_50[0] = 5.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_(pCVar5,local_50)
  ;
  s = K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array + 4;
  K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] = 5.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_(pCVar5,s);
  if ((sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
       array._16_8_ +
       sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
       array._0_8_ == 7) &&
     (sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
      ._8_8_ == 1)) {
    pUVar1 = (UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_> *)
             (P_yy.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
              array + 2);
    sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
    [0] = 0.0;
    sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
    [1] = 0.0;
    sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
    [2] = 1.4013e-45;
    sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
    [3] = 0.0;
    sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
    [4] = 1.4013e-45;
    sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
    [5] = 0.0;
    K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
         2.0;
    local_70._0_4_ = 0x40400000;
    P_yy.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array._8_8_ =
         s;
    Eigen::CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)pUVar1,(Scalar *)local_70);
    if ((sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
         array._16_8_ +
         sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
         array._0_8_ == 2) &&
       (sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
        array._8_8_ == 1)) {
      K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[0] = 0.0;
      K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1] = 0.0;
      K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2] =
           1.4013e-45;
      K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[3] = 0.0;
      K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
           1.4013e-45;
      K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] = 0.0;
      P_yy.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2] =
           1.0;
      local_118._0_4_ = 2.0;
      local_70 = (undefined1  [8])pUVar1;
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *)local_70,
                          (Scalar *)local_118);
      sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
      [0xd] = 1.0;
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar6,sigmaPoints.
                                 super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
                                 m_storage.m_data.array + 0xd);
      local_f8._0_4_ = 1.0;
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar6,(Scalar *)local_f8);
      local_50[0] = 0.0;
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar6,local_50);
      local_38.ptr_._0_4_ = 0x3f800000;
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar6,(Scalar *)&local_38);
      gtest_ar.message_.ptr_._0_4_ = 0x3f800000;
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar6,(Scalar *)&gtest_ar.message_);
      local_74 = 2.0;
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar6,&local_74);
      local_78 = 3.0;
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar6,&local_78);
      mean.super_Matrix<float,_2,_1>.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
      m_storage.m_data.array[0] = 3.0;
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar6,(Scalar *)&mean);
      mean.super_Matrix<float,_2,_1>.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
      m_storage.m_data.array[1] = 2.0;
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar6,mean.super_Matrix<float,_2,_1>.
                                 super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                 m_storage.m_data.array + 1);
      local_84 = 1.0;
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar6,&local_84);
      local_80 = 1.0;
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar6,&local_80);
      local_7c = 2.0;
      Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_(pCVar6,&local_7c);
      if ((K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array.
           _16_8_ + K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                    array._0_8_ == 2) &&
         (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array._8_8_
          == 7)) {
        K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[0] =
             0.0;
        K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1] =
             0.0;
        K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2] =
             1.4013e-45;
        K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[3] =
             0.0;
        K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
             1.4013e-45;
        K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] =
             0.0;
        local_f8._0_4_ = 35.0;
        local_118._0_4_ = 34.0;
        local_70 = (undefined1  [8])local_f8;
        pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                           ((CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)local_70,
                            (Scalar *)local_118);
        sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
        array[0xd] = 34.0;
        pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                           (pCVar7,sigmaPoints.
                                   super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
                                   m_storage.m_data.array + 0xd);
        local_50[0] = 46.0;
        Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_(pCVar7,local_50);
        if ((K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array.
             _16_8_ + K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data
                      .array._0_8_ == 2) &&
           (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array.
            _8_8_ == 2)) {
          K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[0] =
               0.0;
          K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1] =
               0.0;
          K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2] =
               1.4013e-45;
          K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[3] =
               0.0;
          K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
               1.4013e-45;
          K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] =
               0.0;
          local_208._0_4_ = 3.0;
          local_118._0_4_ = 5.0;
          local_70 = (undefined1  [8])local_208;
          this_00 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                              ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_70,
                               (Scalar *)local_118);
          sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
          array[0xd] = 7.0;
          Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                    (this_00,sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>
                             .m_storage.m_data.array + 0xd);
          if ((K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array.
               _16_8_ + K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.
                        m_data.array._0_8_ == 3) &&
             (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array.
              _8_8_ == 1)) {
            local_70 = (undefined1  [8])
                       ((long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                               sigmaWeights_c.super_Matrix<float,_7,_1>.
                               super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage
                               .m_data + 0x14);
            K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[0]
                 = 0.0;
            K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1]
                 = 0.0;
            K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2]
                 = 1.4013e-45;
            K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[3]
                 = 0.0;
            K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4]
                 = 1.4013e-45;
            K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5]
                 = 0.0;
            ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_c.
            super_Matrix<float,_7,_1>.super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.
            m_storage.m_data.array[5] = 3.0;
            local_118._0_4_ = 5.0;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               ((CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *)local_70,
                                (Scalar *)local_118);
            sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data
            .array[0xd] = 3.0;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar8,sigmaPoints.
                                       super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
                                       m_storage.m_data.array + 0xd);
            local_50[0] = 3.0;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar8,local_50);
            local_38.ptr_._0_4_ = 0x3f800000;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar8,(Scalar *)&local_38);
            gtest_ar.message_.ptr_._0_4_ = 0x40400000;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar8,(Scalar *)&gtest_ar.message_);
            local_74 = 3.0;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar8,&local_74);
            local_78 = 5.0;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar8,&local_78);
            mean.super_Matrix<float,_2,_1>.
            super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
                 7.0;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar8,(Scalar *)&mean);
            mean.super_Matrix<float,_2,_1>.
            super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
                 7.0;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar8,mean.super_Matrix<float,_2,_1>.
                                       super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                       m_storage.m_data.array + 1);
            local_84 = 5.0;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar8,&local_84);
            local_80 = 3.0;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar8,&local_80);
            local_7c = 3.0;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar8,&local_7c);
            ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
            super_StandardBase<Kalman::Vector<float,_3>_>.P.
            super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
                 5.0;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar8,(float *)((long)&ukf.
                                                  super_StandardFilterBase<Kalman::Vector<float,_3>_>
                                                  .super_StandardBase<Kalman::Vector<float,_3>_>.P.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data + 0x1c));
            ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
            super_StandardBase<Kalman::Vector<float,_3>_>.P.
            super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
                 7.0;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar8,(float *)((long)&ukf.
                                                  super_StandardFilterBase<Kalman::Vector<float,_3>_>
                                                  .super_StandardBase<Kalman::Vector<float,_3>_>.P.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data + 0x20));
            local_130 = 11.0;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar8,&stack0xfffffffffffffed0);
            local_12c = 9.0;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar8,&stack0xfffffffffffffed4);
            local_128 = 9.0;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar8,&stack0xfffffffffffffed8);
            local_124 = 3.0;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar8,&stack0xfffffffffffffedc);
            local_120 = 5.0;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar8,&stack0xfffffffffffffee0);
            local_11c = 5.0;
            Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                      (pCVar8,&stack0xfffffffffffffee4);
            if ((K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                 array._16_8_ +
                 K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                 array._0_8_ == 3) &&
               (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
                ._8_8_ == 7)) {
              K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
              [0] = 0.0;
              K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
              [1] = 0.0;
              K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
              [2] = 1.4013e-45;
              K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
              [3] = 0.0;
              K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
              [4] = 1.4013e-45;
              K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
              [5] = 0.0;
              local_118._0_4_ = 20.0;
              pUVar1 = (UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_> *)
                       (sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
                        m_storage.m_data.array + 0xd);
              sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.
              m_data.array[0xd] = 20.0;
              local_70 = (undefined1  [8])local_118;
              pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                                 ((CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_70
                                  ,(Scalar *)pUVar1);
              local_50[0] = 20.0;
              pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                                 (pCVar9,local_50);
              local_38.ptr_._0_4_ = 0x42200000;
              pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                                 (pCVar9,(Scalar *)&local_38);
              gtest_ar.message_.ptr_._0_4_ = 0x42200000;
              pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                                 (pCVar9,(Scalar *)&gtest_ar.message_);
              local_74 = 60.0;
              Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                        (pCVar9,&local_74);
              if ((K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                   array._16_8_ +
                   K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                   array._0_8_ == 3) &&
                 (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                  array._8_8_ == 2)) {
                K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
                [0] = 0.0;
                K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
                [1] = 0.0;
                K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
                [2] = 1.4013e-45;
                K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
                [3] = 0.0;
                K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
                [4] = 1.4013e-45;
                K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
                [5] = 0.0;
                sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.
                m_data.array[0xd] = 0.52863437;
                local_50[0] = 0.04405286;
                local_70 = (undefined1  [8])pUVar1;
                pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                                   ((CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)
                                    local_70,local_50);
                local_38.ptr_._0_4_ = 0xbf781b11;
                pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                                   (pCVar9,(Scalar *)&local_38);
                gtest_ar.message_.ptr_._0_4_ = 0x3fcafedf;
                pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                                   (pCVar9,(Scalar *)&gtest_ar.message_);
                local_74 = -0.44052863;
                pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                                   (pCVar9,&local_74);
                local_78 = 1.6299559;
                Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                          (pCVar9,&local_78);
                if ((K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                     array._16_8_ +
                     K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                     array._0_8_ == 3) &&
                   (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                    array._8_8_ == 2)) {
                  Kalman::UnscentedKalmanFilter<Kalman::Vector<float,_3>_>::
                  computeKalmanGain<Kalman::Vector<float,_2>_>
                            ((UnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)local_208,
                             (Vector<float,_2> *)
                             (K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                              m_storage.m_data.array + 4),
                             (SigmaPoints<Kalman::Vector<float,_2>_> *)
                             (P_yy.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.
                              m_storage.m_data.array + 2),
                             (Covariance<Kalman::Vector<float,_2>_> *)local_f8,
                             (KalmanGain<Kalman::Vector<float,_2>_> *)local_70);
                  local_38.ptr_ =
                       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       0x3;
                  gtest_ar.message_.ptr_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
                  testing::internal::CmpHelperEQ<long,long>
                            ((internal *)local_50,"K_ref.rows()","K.rows()",(long *)&local_38,
                             (long *)&gtest_ar.message_);
                  if (local_50[0]._0_1_ == (internal)0x0) {
                    testing::Message::Message((Message *)&local_38);
                    if (gtest_ar._0_8_ == 0) {
                      pcVar11 = "";
                    }
                    else {
                      pcVar11 = *(char **)gtest_ar._0_8_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                               ,0x82,pcVar11);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar.message_);
                    if (((local_38.ptr_ !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) && (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
                       (local_38.ptr_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0)) {
                      (**(code **)(*(long *)local_38.ptr_ + 8))();
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                  }
                  else {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    local_38.ptr_ =
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x2;
                    gtest_ar.message_.ptr_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
                    testing::internal::CmpHelperEQ<long,long>
                              ((internal *)local_50,"K_ref.cols()","K.cols()",(long *)&local_38,
                               (long *)&gtest_ar.message_);
                    if (local_50[0]._0_1_ == (internal)0x0) {
                      testing::Message::Message((Message *)&local_38);
                      if (gtest_ar._0_8_ == 0) {
                        pcVar11 = "";
                      }
                      else {
                        pcVar11 = *(char **)gtest_ar._0_8_;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                                 ,0x82,pcVar11);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar.message_);
                      if (((local_38.ptr_ !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) && (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
                         (local_38.ptr_ !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0)) {
                        (**(code **)(*(long *)local_38.ptr_ + 8))();
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                    }
                    else {
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                      P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage
                      .m_data.array._16_8_ = 0;
                      do {
                        lVar2 = P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>
                                .m_storage.m_data.array._16_8_ * 4;
                        lVar3 = P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>
                                .m_storage.m_data.array._16_8_ * 4;
                        lVar10 = 0;
                        bVar4 = true;
                        do {
                          bVar12 = bVar4;
                          testing::internal::DoubleNearPredFormat
                                    ((internal *)local_50,"K_ref(i,j)","K(i,j)","1e-6",
                                     (double)*(float *)((long)sigmaPoints.
                                                                                                                            
                                                  super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>
                                                  .m_storage.m_data.array + lVar10 + lVar2 + 0x34),
                                     (double)*(float *)((long)K.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>
                                                  .m_storage.m_data.array + lVar10 + lVar3 + -8),
                                     1e-06);
                          if (local_50[0]._0_1_ == (internal)0x0) {
                            testing::Message::Message((Message *)&local_38);
                            if (gtest_ar._0_8_ == 0) {
                              pcVar11 = "";
                            }
                            else {
                              pcVar11 = *(char **)gtest_ar._0_8_;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                                       ,0x82,pcVar11);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar.message_);
                            if (((local_38.ptr_ !=
                                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) && (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
                               (local_38.ptr_ !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0)) {
                              (**(code **)(*(long *)local_38.ptr_ + 8))();
                            }
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&gtest_ar,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0);
                            return;
                          }
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&gtest_ar,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0);
                          lVar10 = 0xc;
                          bVar4 = false;
                        } while (bVar12);
                        P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                        m_storage.m_data.array._16_8_ =
                             P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                             m_storage.m_data.array._16_8_ + 1;
                      } while (P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                               m_storage.m_data.array._16_8_ != 3);
                    }
                  }
                  return;
                }
              }
              pcVar11 = 
              "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 2>>::finished() [MatrixType = Eigen::Matrix<float, 3, 2>]"
              ;
            }
            else {
              pcVar11 = 
              "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 7>>::finished() [MatrixType = Eigen::Matrix<float, 3, 7>]"
              ;
            }
          }
          else {
            pcVar11 = 
            "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 1>>::finished() [MatrixType = Eigen::Matrix<float, 3, 1>]"
            ;
          }
        }
        else {
          pcVar11 = 
          "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 2, 2>>::finished() [MatrixType = Eigen::Matrix<float, 2, 2>]"
          ;
        }
      }
      else {
        pcVar11 = 
        "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 2, 7>>::finished() [MatrixType = Eigen::Matrix<float, 2, 7>]"
        ;
      }
    }
    else {
      pcVar11 = 
      "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 2, 1>>::finished() [MatrixType = Eigen::Matrix<float, 2, 1>]"
      ;
    }
  }
  else {
    pcVar11 = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 7, 1>>::finished() [MatrixType = Eigen::Matrix<float, 7, 1>]"
    ;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,pcVar11);
}

Assistant:

TEST(UnscentedKalmanFilter, computeKalmanGain) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = UnscentedKalmanFilter<Vector<T, 3>>(alpha,beta,kappa);
    
    ukf.sigmaWeights_c << 3, 5, 5, 5, 5, 5, 5;
    
    Vector<T,2> mean;
    mean << 2, 3;
    
    typename UnscentedKalmanFilter<Vector<T, 3>>::template SigmaPoints<decltype(mean)> sigmaPoints;
    sigmaPoints <<
        1,  2,  1,  1,  0,  1,  1,
        2,  3,  3,  2,  1,  1,  2;
    
    Matrix<T,2,2> P_yy;
    P_yy <<
        35, 34,
        34, 46;
    
    // x and sigmaStatePoints
    ukf.x << 3, 5, 7;
    ukf.sigmaStatePoints <<
        3,  5, 3, 3, 1, 3, 3,
        5,  7, 7, 5, 3, 3, 5,
        7, 11, 9, 9, 3, 5, 5;
    
    // Reference value for P
    Matrix<T,3,2> P_xy_ref;
    P_xy_ref <<
        20, 20,
        20, 40,
        40, 60;
    
    // Reference value for K
    Matrix<T, 3, 2> K_ref;
    K_ref <<
        0.528634361233480, 0.044052863436123,
       -0.969162995594713, 1.585903083700440,
       -0.440528634361233, 1.629955947136563;
    
    // Kalman gain to be computed
    Matrix<T, 3, 2> K;
    ukf.computeKalmanGain(mean, sigmaPoints, P_yy, K);
    
    ASSERT_MATRIX_NEAR(K_ref, K, 1e-6);
}